

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O2

CidrRange *
kj::CidrRange::inet6
          (CidrRange *__return_storage_ptr__,ArrayPtr<const_unsigned_short> prefix,
          ArrayPtr<const_unsigned_short> suffix,uint bitCount)

{
  Iterator __begin1;
  size_t sVar1;
  size_t sVar2;
  ArrayPtr<const_unsigned_char> bits_00;
  byte bits [16];
  char *local_28;
  size_t local_20;
  bool local_18;
  Fault f;
  
  sVar2 = suffix.size_;
  bits._0_8_ = sVar2 + prefix.size_;
  bits[8] = '\b';
  bits[9] = '\0';
  bits[10] = '\0';
  bits[0xb] = '\0';
  local_28 = " <= ";
  local_20 = 5;
  local_18 = (ulong)bits._0_8_ < 9;
  if (local_18) {
    bits[0] = '\0';
    bits[1] = '\0';
    bits[2] = '\0';
    bits[3] = '\0';
    bits[4] = '\0';
    bits[5] = '\0';
    bits[6] = '\0';
    bits[7] = '\0';
    bits[8] = '\0';
    bits[9] = '\0';
    bits[10] = '\0';
    bits[0xb] = '\0';
    bits[0xc] = '\0';
    bits[0xd] = '\0';
    bits[0xe] = '\0';
    bits[0xf] = '\0';
    for (sVar1 = 0; prefix.size_ != sVar1; sVar1 = sVar1 + 1) {
      *(unsigned_short *)(bits + sVar1 * 2) = prefix.ptr[sVar1] << 8 | prefix.ptr[sVar1] >> 8;
    }
    for (sVar1 = 0; sVar2 != sVar1; sVar1 = sVar1 + 1) {
      *(unsigned_short *)((long)&local_28 + sVar1 * 2 + sVar2 * -2) =
           suffix.ptr[sVar1] << 8 | suffix.ptr[sVar1] >> 8;
    }
    bits_00.size_ = 0x10;
    bits_00.ptr = bits;
    CidrRange(__return_storage_ptr__,10,bits_00,bitCount);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
             ,0x5c,FAILED,"prefix.size() + suffix.size() <= 8","_kjCondition,",
             (DebugComparison<unsigned_long,_int> *)bits);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

CidrRange CidrRange::inet6(
    ArrayPtr<const uint16_t> prefix, ArrayPtr<const uint16_t> suffix,
    uint bitCount) {
  KJ_REQUIRE(prefix.size() + suffix.size() <= 8);

  byte bits[16] = { 0,0,0,0, 0,0,0,0, 0,0,0,0, 0,0,0,0, };

  for (size_t i: kj::indices(prefix)) {
    bits[i * 2] = prefix[i] >> 8;
    bits[i * 2 + 1] = prefix[i] & 0xff;
  }

  byte* suffixBits = bits + (16 - suffix.size() * 2);
  for (size_t i: kj::indices(suffix)) {
    suffixBits[i * 2] = suffix[i] >> 8;
    suffixBits[i * 2 + 1] = suffix[i] & 0xff;
  }

  return CidrRange(AF_INET6, bits, bitCount);
}